

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_slider_float(nk_context *ctx,float min_value,float *value,float max_value,float value_step)

{
  nk_image *img;
  float fVar1;
  float fVar2;
  nk_vec2 nVar3;
  nk_color c;
  nk_window *pnVar4;
  nk_panel *pnVar5;
  nk_user_font *font;
  _func_void_nk_command_buffer_ptr_nk_handle *p_Var6;
  nk_widget_layout_states nVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  nk_style_slider *pnVar11;
  nk_context *in;
  long lVar12;
  int *piVar13;
  nk_command_buffer *out;
  bool bVar14;
  bool bVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  nk_rect bounds_00;
  nk_rect bounds_01;
  nk_rect r;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect rect_01;
  nk_rect rect_02;
  nk_rect r_00;
  nk_rect r_01;
  nk_rect bounds;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  float local_b8;
  undefined8 local_a8;
  nk_flags local_5c;
  nk_rect local_58;
  undefined1 local_48 [16];
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x4c29,"int nk_slider_float(struct nk_context *, float, float *, float, float)");
  }
  pnVar4 = ctx->current;
  if (pnVar4 == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x4c2a,"int nk_slider_float(struct nk_context *, float, float *, float, float)");
  }
  pnVar5 = pnVar4->layout;
  if (pnVar5 == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x4c2b,"int nk_slider_float(struct nk_context *, float, float *, float, float)");
  }
  if (value != (float *)0x0) {
    nVar7 = nk_widget(&local_58,ctx);
    if (nVar7 != NK_WIDGET_INVALID) {
      in = (nk_context *)0x0;
      if ((nVar7 != NK_WIDGET_ROM) && ((pnVar5->flags & 0x800) == 0)) {
        in = ctx;
      }
      fVar1 = *value;
      out = &pnVar4->buffer;
      fVar16 = (ctx->style).slider.padding.x;
      fVar18 = (ctx->style).slider.padding.y;
      bounds_00.x = local_58.x + fVar16;
      fVar22 = local_58.y + fVar18;
      fVar25 = (ctx->style).slider.cursor_size.x + fVar16 + fVar16;
      if (fVar25 <= local_58.w) {
        fVar25 = local_58.w;
      }
      fVar18 = fVar18 + fVar18;
      fVar23 = fVar18;
      if (fVar18 <= local_58.h) {
        fVar23 = local_58.h;
      }
      fVar25 = fVar25 - (fVar16 + fVar16);
      fVar23 = fVar23 - fVar18;
      fVar16 = fVar1;
      if ((ctx->style).slider.show_buttons != 0) {
        font = (ctx->style).font;
        bounds_00.y = fVar22;
        bounds_00.h = fVar23;
        bounds_00.w = fVar23;
        iVar8 = nk_do_button_symbol(&local_5c,out,bounds_00,(ctx->style).slider.dec_symbol,
                                    NK_BUTTON_DEFAULT,&(ctx->style).slider.dec_button,&in->input,
                                    font);
        if (iVar8 != 0) {
          fVar16 = fVar1 - value_step;
        }
        bounds_01.h = fVar23;
        bounds_01.w = fVar23;
        bounds_01.y = fVar22;
        bounds_01.x = (bounds_00.x + fVar25) - fVar23;
        iVar8 = nk_do_button_symbol(&local_5c,out,bounds_01,(ctx->style).slider.inc_symbol,
                                    NK_BUTTON_DEFAULT,&(ctx->style).slider.inc_button,&in->input,
                                    font);
        if (iVar8 != 0) {
          fVar16 = fVar16 + value_step;
        }
        fVar18 = (ctx->style).slider.spacing.x;
        bounds_00.x = bounds_00.x + fVar23 + fVar18;
        fVar25 = fVar25 - (fVar23 + fVar23 + fVar18 + fVar18);
      }
      fVar18 = min_value;
      if (max_value <= min_value) {
        fVar18 = max_value;
        max_value = min_value;
      }
      if (max_value <= fVar16) {
        fVar16 = max_value;
      }
      local_b8 = fVar18;
      if (fVar18 <= fVar16) {
        local_b8 = fVar16;
      }
      fVar19 = (max_value - fVar18) / value_step;
      fVar16 = (ctx->style).slider.cursor_size.x;
      fVar20 = (ctx->style).slider.cursor_size.y;
      fVar26 = fVar16 * 0.5;
      fVar27 = fVar26 + bounds_00.x;
      fVar28 = fVar25 - fVar16;
      fVar17 = fVar28 / fVar19;
      fVar24 = ((local_b8 - fVar18) / value_step) * fVar17 + fVar27;
      nVar3 = (ctx->style).slider.cursor_size;
      fVar30 = fVar20 * 0.5;
      ctx->last_widget_state = ctx->last_widget_state & 2 | 4;
      if (in == (nk_context *)0x0) {
        bVar14 = false;
      }
      else {
        bVar14 = (in->input).mouse.buttons[0].down != 0;
      }
      fVar29 = (fVar23 * 0.5 + fVar22) - fVar30;
      fVar21 = (fVar17 * 0.5 + fVar24) - fVar26;
      if (in == (nk_context *)0x0) {
        bVar15 = false;
      }
      else {
        fVar2 = (in->input).mouse.buttons[0].clicked_pos.x;
        bVar15 = false;
        if ((fVar21 <= fVar2) && (fVar2 <= fVar16 + fVar21)) {
          fVar2 = (in->input).mouse.buttons[0].clicked_pos.y;
          bVar15 = false;
          if ((fVar29 <= fVar2) && (bVar15 = false, fVar2 <= fVar20 + fVar29)) {
            bVar15 = (in->input).mouse.buttons[0].down == 1;
          }
        }
      }
      if ((bool)(bVar14 & bVar15)) {
        fVar21 = (in->input).mouse.pos.x - (fVar16 * 0.5 + fVar21);
        fVar20 = (ctx->style).slider.padding.x;
        fVar19 = (fVar28 - (fVar20 + fVar20)) / fVar19;
        ctx->last_widget_state = 0x22;
        fVar20 = -fVar21;
        if (-fVar21 <= fVar21) {
          fVar20 = fVar21;
        }
        if (fVar19 <= fVar20) {
          fVar20 = (float)(int)(fVar20 / fVar19);
          fVar20 = local_b8 +
                   (float)(~-(uint)(0.0 < fVar21) & (uint)-fVar20 |
                          (uint)fVar20 & -(uint)(0.0 < fVar21)) * value_step;
          if (max_value <= fVar20) {
            fVar20 = max_value;
          }
          local_b8 = fVar18;
          if (fVar18 <= fVar20) {
            local_b8 = fVar20;
          }
          fVar24 = ((local_b8 - fVar18) / value_step) * fVar17 + fVar27;
          (in->input).mouse.buttons[0].clicked_pos.x = fVar17 * 0.5 + fVar24;
        }
      }
      if ((((in != (nk_context *)0x0) && (fVar18 = (in->input).mouse.pos.x, fVar27 <= fVar18)) &&
          (fVar18 <= fVar27 + fVar28)) &&
         ((fVar18 = (in->input).mouse.pos.y, fVar22 <= fVar18 && (fVar18 <= fVar22 + fVar23)))) {
        ctx->last_widget_state = 0x12;
      }
      if ((((ctx->last_widget_state & 0x10) != 0) &&
          (((uVar10 = 8, in == (nk_context *)0x0 ||
            (fVar18 = (in->input).mouse.prev.x, fVar18 < fVar27)) ||
           ((fVar27 + fVar28 < fVar18 ||
            ((fVar18 = (in->input).mouse.prev.y, fVar18 < fVar22 || (fVar22 + fVar23 < fVar18)))))))
          ) || ((in != (nk_context *)0x0 &&
                ((((fVar18 = (in->input).mouse.prev.x, fVar27 <= fVar18 &&
                   (fVar18 <= fVar27 + fVar28)) &&
                  (fVar18 = (in->input).mouse.prev.y, fVar22 <= fVar18)) &&
                 (uVar10 = 0x40, fVar18 <= fVar22 + fVar23)))))) {
        ctx->last_widget_state = ctx->last_widget_state | uVar10;
      }
      p_Var6 = (ctx->style).slider.draw_begin;
      fVar18 = fVar16;
      if (p_Var6 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
        local_48 = ZEXT416((uint)fVar16);
        (*p_Var6)(out,(nk_handle)(ctx->style).slider.userdata.ptr);
        fVar18 = (float)local_48._0_4_;
      }
      fVar24 = -fVar16 * 0.5 + fVar24;
      if ((ctx->last_widget_state & 0x20) == 0) {
        if ((ctx->last_widget_state & 0x10) == 0) {
          pnVar11 = &(ctx->style).slider;
          lVar12 = 0x738;
          lVar9 = 0x724;
        }
        else {
          pnVar11 = (nk_style_slider *)&(ctx->style).slider.hover;
          lVar12 = 0x758;
          lVar9 = 0x728;
        }
      }
      else {
        pnVar11 = (nk_style_slider *)&(ctx->style).slider.active;
        lVar12 = 0x778;
        lVar9 = 0x72c;
      }
      r.x = bounds_00.x + fVar26;
      fVar25 = fVar25 - fVar18;
      piVar13 = (int *)((long)&(ctx->input).keyboard.keys[0].down + lVar12);
      c = *(nk_color *)((long)&(ctx->input).keyboard.keys[0].down + lVar9);
      fVar16 = fVar23 / -12.0 + fVar30 + fVar29;
      if ((pnVar11->normal).type == NK_STYLE_ITEM_IMAGE) {
        r.y = fVar22;
        r.h = fVar23;
        r.w = fVar25;
        nk_draw_image(out,r,&(pnVar11->normal).data.image,(nk_color)0xffffffff);
      }
      else {
        rect.y = fVar22;
        rect.x = r.x;
        rect.h = fVar23;
        rect.w = fVar25;
        nk_fill_rect(out,rect,(ctx->style).slider.rounding,(pnVar11->normal).data.color);
        rect_00.y = fVar22;
        rect_00.x = r.x;
        rect_00.w = fVar25;
        rect_00.h = fVar23;
        nk_stroke_rect(out,rect_00,(ctx->style).slider.rounding,(ctx->style).slider.border,
                       (ctx->style).slider.border_color);
      }
      rect_01.w = fVar28;
      rect_01.h = fVar23 / 6.0;
      rect_01.x = fVar27;
      rect_01.y = fVar16;
      nk_fill_rect(out,rect_01,(ctx->style).slider.rounding,c);
      rect_02.w = (fVar26 + fVar24) - fVar27;
      rect_02.h = fVar23 / 6.0;
      rect_02.x = fVar27;
      rect_02.y = fVar16;
      nk_fill_rect(out,rect_02,(ctx->style).slider.rounding,(ctx->style).slider.bar_filled);
      img = (nk_image *)(piVar13 + 2);
      if (*piVar13 == 1) {
        r_00.y = fVar29;
        r_00.x = fVar24;
        r_00.w = nVar3.x;
        r_00.h = nVar3.y;
        nk_draw_image(out,r_00,img,(nk_color)0xffffffff);
      }
      else {
        r_01.y = fVar29;
        r_01.x = fVar24;
        r_01.w = nVar3.x;
        r_01.h = nVar3.y;
        nk_fill_circle(out,r_01,(nk_color)(img->handle).id);
      }
      p_Var6 = (ctx->style).slider.draw_end;
      if (p_Var6 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
        (*p_Var6)(out,(nk_handle)(ctx->style).slider.userdata.ptr);
      }
      *value = local_b8;
      nVar7 = (nk_widget_layout_states)(fVar1 != local_b8);
    }
    return nVar7;
  }
  __assert_fail("value",
                "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                ,0x4c2c,"int nk_slider_float(struct nk_context *, float, float *, float, float)");
}

Assistant:

NK_API int
nk_slider_float(struct nk_context *ctx, float min_value, float *value, float max_value,
    float value_step)
{
    struct nk_window *win;
    struct nk_panel *layout;
    struct nk_input *in;
    const struct nk_style *style;

    int ret = 0;
    float old_value;
    struct nk_rect bounds;
    enum nk_widget_layout_states state;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    NK_ASSERT(value);
    if (!ctx || !ctx->current || !ctx->current->layout || !value)
        return ret;

    win = ctx->current;
    style = &ctx->style;
    layout = win->layout;

    state = nk_widget(&bounds, ctx);
    if (!state) return ret;
    in = (state == NK_WIDGET_ROM || layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;

    old_value = *value;
    *value = nk_do_slider(&ctx->last_widget_state, &win->buffer, bounds, min_value,
                old_value, max_value, value_step, &style->slider, in, style->font);
    return (old_value > *value || old_value < *value);
}